

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtlp.c
# Opt level: O1

ssize_t dma_write_aligned(nettlp *nt,uintptr_t addr,void *buf,size_t count,size_t mps)

{
  bool bVar1;
  ssize_t sVar2;
  size_t count_00;
  size_t done;
  long lVar3;
  ulong uVar4;
  
  lVar3 = 0;
  while( true ) {
    count_00 = mps;
    if (count < mps) {
      count_00 = count;
    }
    sVar2 = dma_write(nt,addr,(void *)((long)buf + lVar3),count_00);
    if (sVar2 < 0) break;
    lVar3 = lVar3 + sVar2;
    addr = addr + sVar2;
    uVar4 = count - sVar2;
    bVar1 = (long)count < sVar2;
    count = uVar4;
    if (uVar4 == 0 || bVar1) {
      return sVar2;
    }
  }
  return sVar2;
}

Assistant:

ssize_t
dma_write_aligned(struct nettlp *nt, uintptr_t addr, void *buf,
		  size_t count, size_t mps)
{
	uintptr_t dma_addr;
	size_t len, done;
	ssize_t ret, dma_len;

	done = 0;
	dma_addr = addr;
	dma_len = count;

	do {
		len = dma_len < mps ? dma_len : mps;
		ret = dma_write(nt, dma_addr, buf + done, len);
		if (ret < 0)
			return ret;

		/* for next iteration */
		done += ret;
		dma_addr += ret;
		dma_len -= ret;

	} while (dma_len > 0);

	return ret;
}